

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

MessageSizeCounts __thiscall capnp::_::StructReader::totalSize(StructReader *this)

{
  bool bVar1;
  WordCount64 WVar2;
  unsigned_short *puVar3;
  MessageSizeCounts MVar4;
  MessageSizeCounts local_48;
  ushort local_32;
  Iterator local_30;
  Iterator local_2e;
  Range<unsigned_short> RStack_2c;
  unsigned_short i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_short> *__range2;
  StructReader *this_local;
  MessageSizeCounts result;
  
  WVar2 = WireHelpers::roundBitsUpToWords((ulong)this->dataSize);
  this_local = (StructReader *)(WVar2 + this->pointerCount);
  result.wordCount._0_4_ = 0;
  RStack_2c = kj::zeroTo<unsigned_short>(this->pointerCount);
  ___end2 = &stack0xffffffffffffffd4;
  local_2e = kj::Range<unsigned_short>::begin(___end2);
  local_30 = kj::Range<unsigned_short>::end(___end2);
  while( true ) {
    bVar1 = kj::Range<unsigned_short>::Iterator::operator!=(&local_2e,&local_30);
    if (!bVar1) break;
    puVar3 = kj::Range<unsigned_short>::Iterator::operator*(&local_2e);
    local_32 = *puVar3;
    MVar4 = WireHelpers::totalSize
                      (this->segment,this->pointers + (int)(uint)local_32,this->nestingLimit);
    local_48.wordCount = MVar4.wordCount;
    local_48.capCount = MVar4.capCount;
    MessageSizeCounts::operator+=((MessageSizeCounts *)&this_local,&local_48);
    kj::Range<unsigned_short>::Iterator::operator++(&local_2e);
  }
  if (this->segment != (SegmentReader *)0x0) {
    SegmentReader::unread(this->segment,(WordCount64)this_local);
  }
  MVar4.capCount = (undefined4)result.wordCount;
  MVar4.wordCount = (WordCountN<61,_uint64_t>)this_local;
  MVar4._12_4_ = 0;
  return MVar4;
}

Assistant:

MessageSizeCounts StructReader::totalSize() const {
  MessageSizeCounts result = {
    WireHelpers::roundBitsUpToWords(dataSize) + pointerCount * WORDS_PER_POINTER, 0 };

  for (auto i: kj::zeroTo(pointerCount)) {
    result += WireHelpers::totalSize(segment, pointers + i, nestingLimit);
  }

  if (segment != nullptr) {
    // This traversal should not count against the read limit, because it's highly likely that
    // the caller is going to traverse the object again, e.g. to copy it.
    segment->unread(result.wordCount);
  }

  return result;
}